

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ShowVarsTask::checkArguments
          (ShowVarsTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  bool bVar4;
  bool bVar5;
  Symbol *pSVar6;
  long lVar7;
  Args *__range3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,0,0x7fffffff);
  lVar7 = 400;
  if (bVar4) {
    sVar2 = (args->_M_extent)._M_extent_value;
    bVar4 = sVar2 == 0;
    if (!bVar4) {
      ppEVar3 = args->_M_ptr;
      lVar7 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar3 + lVar7);
        pSVar6 = Expression::getSymbolReference(this_00,true);
        if ((pSVar6 == (Symbol *)0x0) || (bVar5 = true, 1 < pSVar6->kind - Net)) {
          bVar5 = Scope::isUninstantiated((context->scope).ptr);
          if (!bVar5) {
            ASTContext::addDiag(context,(DiagCode)0xf000b,this_00->sourceRange);
          }
          args = (Args *)pCVar1->errorType;
          bVar5 = false;
        }
        if (!bVar5) break;
        lVar7 = lVar7 + 8;
        bVar4 = sVar2 << 3 == lVar7;
      } while (!bVar4);
    }
    lVar7 = 0x188;
    if (!bVar4) {
      return (Type *)args;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar7);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || (sym->kind != SymbolKind::Variable && sym->kind != SymbolKind::Net)) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getVoidType();
    }